

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphValidator.cpp
# Opt level: O3

bool __thiscall
dg::pta::PointerGraphValidator::reportInvalOperands
          (PointerGraphValidator *this,PSNode *nd,string *user_err)

{
  long *plVar1;
  long *plVar2;
  string *errors;
  long *plVar3;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  errors = &this->errors;
  std::__cxx11::string::append((char *)errors);
  dumpNode(nd,errors);
  if (user_err->_M_string_length != 0) {
    std::operator+(&local_38,"(",user_err);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_38);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_48 = *plVar2;
      lStack_40 = plVar1[3];
      plVar3 = &local_48;
    }
    else {
      local_48 = *plVar2;
      plVar3 = (long *)*plVar1;
    }
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::_M_append((char *)errors,(ulong)plVar3);
    if (plVar3 != &local_48) {
      operator_delete(plVar3,local_48 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool PointerGraphValidator::reportInvalOperands(const PSNode *nd,
                                                const std::string &user_err) {
    errors += "Invalid operands:\n";
    dumpNode(nd, errors);

    if (!user_err.empty())
        errors += "(" + user_err + ")\n";

    return true;
}